

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

result * __thiscall
baryonyx::itm::select_cost<float,baryonyx::itm::minimize_tag>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb,bool is_optimization)

{
  byte bVar1;
  bool bVar2;
  bool is_optimization_local;
  problem *pb_local;
  context *ctx_local;
  
  bVar1 = (byte)pb & 1;
  bVar2 = std::
          vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
          ::empty((vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   *)&(ctx->parameters).kappa_max);
  if (bVar2) {
    solve_or_optimize<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
              (__return_storage_ptr__,this,ctx,(problem *)(ulong)bVar1,is_optimization);
  }
  else {
    solve_or_optimize<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
              (__return_storage_ptr__,this,ctx,(problem *)(ulong)bVar1,is_optimization);
  }
  return __return_storage_ptr__;
}

Assistant:

static result
select_cost(const context& ctx, const problem& pb, bool is_optimization)
{
    return pb.objective.qelements.empty()
             ? solve_or_optimize<Float,
                                 Mode,
                                 baryonyx::itm::default_cost_type<Float>>(
                 ctx, pb, is_optimization)
             : solve_or_optimize<Float,
                                 Mode,
                                 baryonyx::itm::quadratic_cost_type<Float>>(
                 ctx, pb, is_optimization);
}